

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.h
# Opt level: O0

double __thiscall
BayesianGameIdenticalPayoff::GetUtility
          (BayesianGameIdenticalPayoff *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypeIndices,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indActionIndices)

{
  undefined8 *puVar1;
  Index IVar2;
  int iVar3;
  undefined8 in_RDX;
  BayesianGameBase *in_RDI;
  double dVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  
  puVar1 = *(undefined8 **)&in_RDI[1]._m_useSparse;
  IVar2 = BayesianGameBase::IndividualToJointTypeIndices(in_RDI,in_stack_ffffffffffffffc8);
  iVar3 = (*(in_RDI->super_Interface_ProblemToPolicyDiscretePure).
            super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[7])
                    (in_RDI,in_RDX);
  dVar4 = (double)(**(code **)*puVar1)(puVar1,IVar2,iVar3);
  return dVar4;
}

Assistant:

double GetUtility(const std::vector<Index>& indTypeIndices, 
                const std::vector<Index>& indActionIndices ) const
        {return(_m_utilFunction->Get(
                IndividualToJointTypeIndices(indTypeIndices),
                IndividualToJointActionIndices(indActionIndices) ));}